

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix-qdf.cc
# Opt level: O2

void __thiscall QdfFixer::processLines(QdfFixer *this,string *input)

{
  string *__n;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_00;
  vector<long_long,_std::allocator<long_long>_> *this_01;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_02;
  string *this_03;
  pointer pQVar1;
  anon_enum_32 aVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  int iVar7;
  size_type sVar8;
  ostream *poVar9;
  longlong lVar10;
  size_type sVar11;
  unsigned_long uVar12;
  unsigned_long_long val;
  unsigned_long_long val_00;
  long lVar13;
  size_t sVar14;
  char *extraout_RDX;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar15;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_04;
  QdfFixer *this_05;
  QPDFXRefEntry *e_1;
  QPDFXRefEntry *e;
  pointer pQVar16;
  basic_string_view<char,_std::char_traits<char>_> bVar17;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  basic_string_view<char,_std::char_traits<char>_> __str_03;
  basic_string_view<char,_std::char_traits<char>_> __str_04;
  basic_string_view<char,_std::char_traits<char>_> __str_05;
  basic_string_view<char,_std::char_traits<char>_> __str_06;
  basic_string_view<char,_std::char_traits<char>_> __str_07;
  basic_string_view<char,_std::char_traits<char>_> __str_08;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  QdfFixer *local_140;
  string new_length;
  smatch m;
  difference_type len_line;
  anon_class_24_3_b7c57803 matches;
  string_view input_view;
  const_iterator b_line;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_140 = this;
  if (processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_ == '\0') goto LAB_0011b44f;
LAB_0011a860:
  if (processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_ == '\0') {
    iVar7 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_);
    if (iVar7 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_,
                 "/Extends (\\d+ 0 R)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_extends_abi_cxx11_);
      this = local_140;
    }
  }
  if (processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_ == '\0') {
    iVar7 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::
                                 re_ostream_obj_abi_cxx11_);
    if (iVar7 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_,
                 "^%% Object stream: object (\\d+)",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_ostream_obj_abi_cxx11_);
      this = local_140;
    }
  }
  if (processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_ == '\0') {
    iVar7 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_);
    if (iVar7 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_,"^\\d+\n$",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_);
      this = local_140;
    }
  }
  if (processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_ == '\0') {
    iVar7 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_);
    if (iVar7 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_,"^  /Size \\d+\n$"
                 ,0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_);
      this = local_140;
    }
  }
  this->lineno = 0;
  matches.len_line = &len_line;
  len_line = 0;
  local_158 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
  input_view._M_str = (input->_M_dataplus)._M_p;
  input_view._M_len = input->_M_string_length;
  matches.b_line = &b_line;
  matches.m = &m;
  m.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m._M_begin._M_current = (char *)0x0;
  m.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  m.
  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  .
  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->ostream;
  this_01 = &this->ostream_offsets;
  this_02 = &this->ostream_discarded;
  this_03 = &this->ostream_extends;
  b_line._M_current = input_view._M_str;
  do {
    input = (string *)&input_view;
    this->lineno = this->lineno + 1;
    this->last_offset = this->offset;
    b_line._M_current = b_line._M_current + len_line;
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)input,'\n',0);
    if (sVar8 == 0xffffffffffffffff) {
      local_158._M_str = input_view._M_str;
      local_158._M_len = input_view._M_len;
      bVar17._M_str = extraout_RDX;
      bVar17._M_len = input_view._M_len;
    }
    else {
      __n = (string *)(sVar8 + 1);
      bVar17 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         ((basic_string_view<char,_std::char_traits<char>_> *)input,0,(size_type)__n
                         );
      input_view._M_str = input_view._M_str + (long)__n;
      input_view._M_len = input_view._M_len - (long)__n;
      input = __n;
      local_158 = bVar17;
    }
    len_line = bVar17._M_len;
    this->offset = this->offset + len_line;
    switch(this->state) {
    case st_top:
      bVar3 = processLines::anon_class_24_3_b7c57803::operator()
                        (&matches,&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_)
      ;
      if (bVar3) {
        lVar13 = (long)m.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)m.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar13 == 0) || (0xfffffffffffffffd < lVar13 / 0x18 - 5U)) {
          psVar15 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)m.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x48);
        }
        else {
          psVar15 = m.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str(&new_length,psVar15);
        checkObjId(this,&new_length);
        std::__cxx11::string::~string((string *)&new_length);
        aVar2 = st_in_obj;
      }
      else {
        __str_06._M_str = "xref\n";
        __str_06._M_len = 5;
        iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_158,__str_06);
        if (iVar7 != 0) goto LAB_0011b0b3;
        this->xref_offset = this->last_offset;
        aVar2 = st_at_xref;
      }
      this->state = aVar2;
      goto LAB_0011b0b3;
    case st_in_obj:
      std::__ostream_insert<char,std::char_traits<char>>(this->out,local_158._M_str,len_line);
      __str_03._M_str = "stream\n";
      __str_03._M_len = 7;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_158,__str_03);
      if (iVar7 == 0) {
        this->state = st_in_stream;
        this->stream_start = this->offset;
      }
      else {
        __str_04._M_str = "endobj\n";
        __str_04._M_len = 7;
        iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_158,__str_04);
        if (iVar7 == 0) {
          this->state = st_top;
        }
        else {
          sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find
                             (&local_158,"/Type /ObjStm",0,0xd);
          if (sVar11 == 0xffffffffffffffff) {
            sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find
                               (&local_158,"/Type /XRef",0,0xb);
            if (sVar11 != 0xffffffffffffffff) {
              lVar13 = QPDFXRefEntry::getOffset();
              this->xref_offset = lVar13;
              sVar14 = 0;
              for (; lVar13 != 0; lVar13 = lVar13 >> 8) {
                sVar14 = sVar14 + 1;
              }
              this->xref_f1_nbytes = sVar14;
              pQVar1 = (this->xref).
                       super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              iVar7 = 1;
              for (pQVar16 = (this->xref).
                             super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
                             _M_impl.super__Vector_impl_data._M_start; pQVar16 != pQVar1;
                  pQVar16 = pQVar16 + 0x18) {
                iVar4 = QPDFXRefEntry::getType();
                if (iVar4 == 2) {
                  iVar4 = QPDFXRefEntry::getObjStreamIndex();
                  if (iVar7 < iVar4) {
                    iVar7 = QPDFXRefEntry::getObjStreamIndex();
                  }
                }
              }
              sVar14 = this->xref_f2_nbytes;
              for (; sVar14 = sVar14 + 1, iVar7 != 0; iVar7 = iVar7 >> 8) {
                this->xref_f2_nbytes = sVar14;
              }
              this->xref_size =
                   ((long)(this->xref).
                          super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->xref).
                         super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>._M_impl.
                         super__Vector_impl_data._M_start) / 0x18 + 1;
              poVar9 = std::operator<<(this->out,"  /Length ");
              poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
              poVar9 = std::operator<<(poVar9,"\n");
              poVar9 = std::operator<<(poVar9,"  /W [ 1 ");
              poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
              poVar9 = std::operator<<(poVar9," ");
              poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
              std::operator<<(poVar9," ]\n");
              this->state = st_in_xref_stream_dict;
            }
          }
          else {
            this->state = st_in_ostream_dict;
            this->ostream_id = this->last_obj;
          }
        }
      }
      break;
    case st_in_stream:
      __str_01._M_str = "endstream\n";
      __str_01._M_len = 10;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_158,__str_01);
      if (iVar7 == 0) {
        new_length._M_dataplus._M_p = (pointer)(this->last_offset - this->stream_start);
        uVar12 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert
                           ((longlong *)&new_length);
        this->stream_length = uVar12;
        this->state = st_after_stream;
      }
      goto LAB_0011b0b3;
    case st_after_stream:
      __str_02._M_str = "%QDF: ignore_newline\n";
      __str_02._M_len = 0x15;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_158,__str_02);
      if (iVar7 == 0) {
        if (this->stream_length != 0) {
          this->stream_length = this->stream_length - 1;
        }
      }
      else {
        bVar3 = processLines::anon_class_24_3_b7c57803::operator()
                          (&matches,&processLines(std::__cxx11::string_const&)::
                                     re_n_0_obj_abi_cxx11_);
        if (bVar3) {
          lVar13 = (long)m.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)m.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar13 == 0) || (0xfffffffffffffffd < lVar13 / 0x18 - 5U)) {
            psVar15 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)m.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x48);
          }
          else {
            psVar15 = m.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&new_length,psVar15);
          checkObjId(this,&new_length);
          std::__cxx11::string::~string((string *)&new_length);
          this->state = st_in_length;
        }
      }
LAB_0011b0b3:
      std::__ostream_insert<char,std::char_traits<char>>
                (this->out,local_158._M_str,local_158._M_len);
      break;
    case st_in_ostream_dict:
      __str_00._M_str = "stream\n";
      __str_00._M_len = 7;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_158,__str_00);
      if (iVar7 == 0) {
        this->state = st_in_ostream_offsets;
      }
      else {
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::push_back(this_02,&local_158);
        bVar3 = processLines::anon_class_24_3_b7c57803::operator()
                          (&matches,&processLines(std::__cxx11::string_const&)::
                                     re_extends_abi_cxx11_);
        if (bVar3) {
          lVar13 = (long)m.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)m.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          if ((lVar13 == 0) || (0xfffffffffffffffd < lVar13 / 0x18 - 5U)) {
            psVar15 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)m.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x48);
          }
          else {
            psVar15 = m.
                      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          std::__cxx11::
          sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::str(&new_length,psVar15);
          std::__cxx11::string::operator=((string *)this_03,(string *)&new_length);
          goto LAB_0011b0e9;
        }
      }
      break;
    case st_in_ostream_offsets:
      bVar3 = processLines::anon_class_24_3_b7c57803::operator()
                        (&matches,&processLines(std::__cxx11::string_const&)::
                                   re_ostream_obj_abi_cxx11_);
      this_04 = this_02;
      if (bVar3) {
        lVar13 = (long)m.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)m.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar13 == 0) || (0xfffffffffffffffd < lVar13 / 0x18 - 5U)) {
          psVar15 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)m.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x48);
        }
        else {
          psVar15 = m.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str(&new_length,psVar15);
        checkObjId(this,&new_length);
        std::__cxx11::string::~string((string *)&new_length);
        this->stream_start = this->last_offset;
        aVar2 = st_in_ostream_outer;
        goto LAB_0011b03d;
      }
      goto LAB_0011b046;
    case st_in_ostream_outer:
      adjustOstreamXref(this);
      new_length._M_dataplus._M_p = (pointer)(this->last_offset - this->stream_start);
      std::vector<long_long,_std::allocator<long_long>_>::emplace_back<long_long>
                (this_01,(longlong *)&new_length);
      aVar2 = st_in_ostream_obj;
LAB_0011b03d:
      this->state = aVar2;
      this_04 = this_00;
LAB_0011b046:
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back(this_04,&local_158);
      break;
    case st_in_ostream_obj:
      std::
      vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::push_back(this_00,&local_158);
      bVar3 = processLines::anon_class_24_3_b7c57803::operator()
                        (&matches,&processLines(std::__cxx11::string_const&)::
                                   re_ostream_obj_abi_cxx11_);
      if (bVar3) {
        lVar13 = (long)m.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)m.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if ((lVar13 == 0) || (0xfffffffffffffffd < lVar13 / 0x18 - 5U)) {
          psVar15 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)m.
                              super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar13 + -0x48);
        }
        else {
          psVar15 = m.
                    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1;
        }
        std::__cxx11::
        sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::str(&new_length,psVar15);
        checkObjId(this,&new_length);
        std::__cxx11::string::~string((string *)&new_length);
        this->state = st_in_ostream_outer;
      }
      else {
        __str_07._M_str = "endstream\n";
        __str_07._M_len = 10;
        iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_158,__str_07);
        if (iVar7 == 0) {
          new_length._M_dataplus._M_p = (pointer)(this->last_offset - this->stream_start);
          uVar12 = QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert
                             ((longlong *)&new_length);
          this->stream_length = uVar12;
          writeOstream(this);
          this->state = st_in_obj;
        }
      }
      break;
    case st_in_xref_stream_dict:
      sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_158,"/Length",0,7)
      ;
      if (sVar11 == 0xffffffffffffffff) {
        sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_158,"/W",0,2);
        if (sVar11 == 0xffffffffffffffff) {
          sVar11 = std::basic_string_view<char,_std::char_traits<char>_>::find
                             (&local_158,"/Size",0,5);
          if (sVar11 == 0xffffffffffffffff) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (this->out,local_158._M_str,local_158._M_len);
          }
          else {
            poVar9 = std::operator<<(this->out,"  /Size ");
            poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
            std::operator<<(poVar9,"\n");
          }
        }
      }
      __str_08._M_str = "stream\n";
      __str_08._M_len = 7;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_158,__str_08);
      if (iVar7 == 0) {
        writeBinary(this,0,1);
        writeBinary(this,0,this->xref_f1_nbytes);
        writeBinary(this,0,this->xref_f2_nbytes);
        pQVar1 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pQVar16 = (this->xref).
                       super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>._M_impl.
                       super__Vector_impl_data._M_start; pQVar16 != pQVar1; pQVar16 = pQVar16 + 0x18
            ) {
          uVar5 = QPDFXRefEntry::getType();
          new_length._M_dataplus._M_p._0_4_ = uVar5;
          uVar6 = QIntC::IntConverter<int,_unsigned_int,_true,_false>::convert((int *)&new_length);
          if (uVar6 == 1) {
            new_length._M_dataplus._M_p = (pointer)QPDFXRefEntry::getOffset();
            val = QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::convert
                            ((longlong *)&new_length);
            val_00 = 0;
          }
          else {
            uVar5 = QPDFXRefEntry::getObjStreamNumber();
            new_length._M_dataplus._M_p._0_4_ = uVar5;
            val = QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::convert
                            ((int *)&new_length);
            uVar5 = QPDFXRefEntry::getObjStreamIndex();
            new_length._M_dataplus._M_p._0_4_ = uVar5;
            val_00 = QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::convert
                               ((int *)&new_length);
          }
          this = local_140;
          writeBinary(local_140,(ulong)uVar6,1);
          writeBinary(this,val,this->xref_f1_nbytes);
          writeBinary(this,val_00,this->xref_f2_nbytes);
        }
        poVar9 = std::operator<<(this->out,"\nendstream\nendobj\n\n");
        poVar9 = std::operator<<(poVar9,"startxref\n");
        poVar9 = std::ostream::_M_insert<long_long>((longlong)poVar9);
        std::operator<<(poVar9,"\n%%EOF\n");
LAB_0011b3a8:
        this->state = st_done;
      }
      break;
    case st_in_length:
      bVar3 = processLines::anon_class_24_3_b7c57803::operator()
                        (&matches,&processLines(std::__cxx11::string_const&)::re_num_abi_cxx11_);
      if (!bVar3) goto LAB_0011b3e2;
      std::__cxx11::to_string(&local_90,this->stream_length);
      std::operator+(&new_length,&local_90,"\n");
      std::__cxx11::string::~string((string *)&local_90);
      local_90._M_dataplus._M_p = (pointer)local_158._M_len;
      lVar10 = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert
                         ((unsigned_long *)&local_90);
      this->offset = this->offset - lVar10;
      local_90._M_dataplus._M_p = (pointer)new_length._M_string_length;
      lVar10 = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert
                         ((unsigned_long *)&local_90);
      this->offset = this->offset + lVar10;
      std::operator<<(this->out,(string *)&new_length);
      this->state = st_top;
LAB_0011b0e9:
      std::__cxx11::string::~string((string *)&new_length);
      break;
    case st_at_xref:
      poVar9 = std::operator<<(this->out,"0 ");
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::operator<<(poVar9,"\n0000000000 65535 f \n");
      pQVar1 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pQVar16 = (this->xref).super__Vector_base<QPDFXRefEntry,_std::allocator<QPDFXRefEntry>_>.
                     _M_impl.super__Vector_impl_data._M_start; pQVar16 != pQVar1;
          pQVar16 = pQVar16 + 0x18) {
        poVar9 = this->out;
        iVar7 = QPDFXRefEntry::getOffset();
        QUtil::int_to_string_abi_cxx11_((longlong)&new_length,iVar7);
        poVar9 = std::operator<<(poVar9,(string *)&new_length);
        std::operator<<(poVar9," 00000 n \n");
        std::__cxx11::string::~string((string *)&new_length);
      }
      this->state = st_before_trailer;
      break;
    case st_before_trailer:
      __str._M_str = "trailer <<\n";
      __str._M_len = 0xb;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_158,__str);
      if (iVar7 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->out,local_158._M_str,local_158._M_len);
        this->state = st_in_trailer;
      }
      break;
    case st_in_trailer:
      bVar3 = processLines::anon_class_24_3_b7c57803::operator()
                        (&matches,&processLines(std::__cxx11::string_const&)::re_size_n_abi_cxx11_);
      if (bVar3) {
        poVar9 = std::operator<<(this->out,"  /Size ");
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::operator<<(poVar9,"\n");
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->out,local_158._M_str,local_158._M_len);
      }
      __str_05._M_str = ">>\n";
      __str_05._M_len = 3;
      iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_158,__str_05);
      if (iVar7 == 0) {
        poVar9 = std::operator<<(this->out,"startxref\n");
        poVar9 = std::ostream::_M_insert<long_long>((longlong)poVar9);
        std::operator<<(poVar9,"\n%%EOF\n");
        goto LAB_0011b3a8;
      }
    }
    if (sVar8 == 0xffffffffffffffff) {
      std::
      _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&m);
      return;
    }
  } while( true );
LAB_0011b3e2:
  std::operator+(&local_50,&this->filename,":");
  std::__cxx11::to_string(&local_70,local_140->lineno);
  std::operator+(&local_90,&local_50,&local_70);
  this_05 = (QdfFixer *)&new_length;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_05,
                 &local_90,": expected integer");
  fatal(this_05,&new_length);
LAB_0011b44f:
  iVar7 = __cxa_guard_acquire(&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_);
  if (iVar7 != 0) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_,"^(\\d+) 0 obj\n$",
               0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&processLines(std::__cxx11::string_const&)::re_n_0_obj_abi_cxx11_);
    this = local_140;
  }
  goto LAB_0011a860;
}

Assistant:

void
QdfFixer::processLines(std::string const& input)
{
    using namespace std::literals;

    static const std::regex re_n_0_obj("^(\\d+) 0 obj\n$");
    static const std::regex re_extends("/Extends (\\d+ 0 R)");
    static const std::regex re_ostream_obj("^%% Object stream: object (\\d+)");
    static const std::regex re_num("^\\d+\n$");
    static const std::regex re_size_n("^  /Size \\d+\n$");

    auto sv_diff = [](size_t i) { return static_cast<std::string_view::difference_type>(i); };

    lineno = 0;
    bool more = true;
    auto len_line = sv_diff(0);

    std::string_view line;
    std::string_view input_view{input.data(), input.size()};
    size_t offs = 0;

    auto b_line = input.cbegin();
    std::smatch m;
    auto const matches = [&m, &b_line, &len_line](std::regex const& r) {
        return std::regex_search(b_line, b_line + len_line, m, r);
    };

    while (more) {
        ++lineno;
        last_offset = offset;
        b_line += len_line;

        offs = input_view.find('\n');
        if (offs == std::string::npos) {
            more = false;
            line = input_view;
        } else {
            offs++;
            line = input_view.substr(0, offs);
            input_view.remove_prefix(offs);
        }
        len_line = sv_diff(line.size());
        offset += len_line;

        if (state == st_top) {
            if (matches(re_n_0_obj)) {
                checkObjId(m[1].str());
                state = st_in_obj;
            } else if (line.compare("xref\n"sv) == 0) {
                xref_offset = last_offset;
                state = st_at_xref;
            }
            out << line;
        } else if (state == st_in_obj) {
            out << line;
            if (line.compare("stream\n"sv) == 0) {
                state = st_in_stream;
                stream_start = offset;
            } else if (line.compare("endobj\n"sv) == 0) {
                state = st_top;
            } else if (line.find("/Type /ObjStm"sv) != line.npos) {
                state = st_in_ostream_dict;
                ostream_id = last_obj;
            } else if (line.find("/Type /XRef"sv) != line.npos) {
                xref_offset = xref.back().getOffset();
                xref_f1_nbytes = 0;
                auto t = xref_offset;
                while (t) {
                    t >>= 8;
                    ++xref_f1_nbytes;
                }
                // Figure out how many bytes we need for ostream
                // index. Make sure we get at least 1 byte even if
                // there are no object streams.
                int max_objects = 1;
                for (auto const& e: xref) {
                    if ((e.getType() == 2) && (e.getObjStreamIndex() > max_objects)) {
                        max_objects = e.getObjStreamIndex();
                    }
                }
                while (max_objects) {
                    max_objects >>= 8;
                    ++xref_f2_nbytes;
                }
                auto esize = 1 + xref_f1_nbytes + xref_f2_nbytes;
                xref_size = 1 + xref.size();
                auto length = xref_size * esize;
                out << "  /Length " << length << "\n"
                    << "  /W [ 1 " << xref_f1_nbytes << " " << xref_f2_nbytes << " ]\n";
                state = st_in_xref_stream_dict;
            }
        } else if (state == st_in_ostream_dict) {
            if (line.compare("stream\n"sv) == 0) {
                state = st_in_ostream_offsets;
            } else {
                ostream_discarded.push_back(line);
                if (matches(re_extends)) {
                    ostream_extends = m[1].str();
                }
            }
            // discard line
        } else if (state == st_in_ostream_offsets) {
            if (matches(re_ostream_obj)) {
                checkObjId(m[1].str());
                stream_start = last_offset;
                state = st_in_ostream_outer;
                ostream.push_back(line);
            } else {
                ostream_discarded.push_back(line);
            }
            // discard line
        } else if (state == st_in_ostream_outer) {
            adjustOstreamXref();
            ostream_offsets.push_back(last_offset - stream_start);
            state = st_in_ostream_obj;
            ostream.push_back(line);
        } else if (state == st_in_ostream_obj) {
            ostream.push_back(line);
            if (matches(re_ostream_obj)) {
                checkObjId(m[1].str());
                state = st_in_ostream_outer;
            } else if (line.compare("endstream\n"sv) == 0) {
                stream_length = QIntC::to_size(last_offset - stream_start);
                writeOstream();
                state = st_in_obj;
            }
        } else if (state == st_in_xref_stream_dict) {
            if ((line.find("/Length"sv) != line.npos) || (line.find("/W"sv) != line.npos)) {
                // already printed
            } else if (line.find("/Size"sv) != line.npos) {
                auto size = 1 + xref.size();
                out << "  /Size " << size << "\n";
            } else {
                out << line;
            }
            if (line.compare("stream\n"sv) == 0) {
                writeBinary(0, 1);
                writeBinary(0, xref_f1_nbytes);
                writeBinary(0, xref_f2_nbytes);
                for (auto const& x: xref) {
                    unsigned long long f1 = 0;
                    unsigned long long f2 = 0;
                    unsigned int type = QIntC::to_uint(x.getType());
                    if (1 == type) {
                        f1 = QIntC::to_ulonglong(x.getOffset());
                    } else {
                        f1 = QIntC::to_ulonglong(x.getObjStreamNumber());
                        f2 = QIntC::to_ulonglong(x.getObjStreamIndex());
                    }
                    writeBinary(type, 1);
                    writeBinary(f1, xref_f1_nbytes);
                    writeBinary(f2, xref_f2_nbytes);
                }
                out << "\nendstream\nendobj\n\n"
                    << "startxref\n"
                    << xref_offset << "\n%%EOF\n";
                state = st_done;
            }
        } else if (state == st_in_stream) {
            if (line.compare("endstream\n"sv) == 0) {
                stream_length = QIntC::to_size(last_offset - stream_start);
                state = st_after_stream;
            }
            out << line;
        } else if (state == st_after_stream) {
            if (line.compare("%QDF: ignore_newline\n"sv) == 0) {
                if (stream_length > 0) {
                    --stream_length;
                }
            } else if (matches(re_n_0_obj)) {
                checkObjId(m[1].str());
                state = st_in_length;
            }
            out << line;
        } else if (state == st_in_length) {
            if (!matches(re_num)) {
                fatal(filename + ":" + std::to_string(lineno) + ": expected integer");
            }
            std::string new_length = std::to_string(stream_length) + "\n";
            offset -= QIntC::to_offset(line.length());
            offset += QIntC::to_offset(new_length.length());
            out << new_length;
            state = st_top;
        } else if (state == st_at_xref) {
            auto n = xref.size();
            out << "0 " << 1 + n << "\n0000000000 65535 f \n";
            for (auto const& e: xref) {
                out << QUtil::int_to_string(e.getOffset(), 10) << " 00000 n \n";
            }
            state = st_before_trailer;
        } else if (state == st_before_trailer) {
            if (line.compare("trailer <<\n"sv) == 0) {
                out << line;
                state = st_in_trailer;
            }
            // no output
        } else if (state == st_in_trailer) {
            if (matches(re_size_n)) {
                out << "  /Size " << 1 + xref.size() << "\n";
            } else {
                out << line;
            }
            if (line.compare(">>\n"sv) == 0) {
                out << "startxref\n" << xref_offset << "\n%%EOF\n";
                state = st_done;
            }
        } else if (state == st_done) {
            // ignore
        }
    }
}